

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void check_for_missing<ImputedData<long,long_double>,InputData<float,long>>
               (InputData<float,_long> *input_data,
               vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
               *impute_vec,
               robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *impute_map,int nthreads)

{
  vector<char,_std::allocator<char>_> *this;
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  pointer pcVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  long *plVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  int *piVar13;
  value_type_conflict5 local_29;
  
  this = &input_data->has_missing;
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign(this,input_data->nrows,&local_29);
  plVar8 = input_data->Xc_indptr;
  if (plVar8 != (long *)0x0) {
    uVar5 = 0;
    while (uVar5 < input_data->ncols_numeric) {
      puVar1 = (ulong *)(plVar8 + uVar5);
      uVar5 = uVar5 + 1;
      for (uVar10 = *puVar1; uVar10 < (ulong)plVar8[uVar5]; uVar10 = uVar10 + 1) {
        if (0x7f7fffff < (uint)ABS(input_data->Xc[uVar10])) {
          (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[input_data->Xc_ind[uVar10]] = '\x01';
          plVar8 = input_data->Xc_indptr;
        }
      }
    }
  }
  if (input_data->categ_data != (int *)0x0 || input_data->numeric_data != (float *)0x0) {
    lVar7 = 0;
    for (uVar5 = 0; uVar5 < input_data->nrows; uVar5 = uVar5 + 1) {
      if (input_data->Xc_indptr == (long *)0x0) {
        lVar11 = input_data->ncols_numeric + 1;
        puVar12 = (uint *)((long)input_data->numeric_data + lVar7);
        do {
          lVar11 = lVar11 + -1;
          if (lVar11 == 0) goto LAB_00291856;
          uVar2 = *puVar12;
          puVar12 = puVar12 + input_data->nrows;
        } while ((uVar2 & 0x7fffffff) < 0x7f800000);
        (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = '\x01';
      }
LAB_00291856:
      pcVar4 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar4[uVar5] == '\0') {
        lVar11 = input_data->ncols_categ + 1;
        piVar13 = (int *)((long)input_data->categ_data + lVar7);
        do {
          lVar11 = lVar11 + -1;
          if (lVar11 == 0) goto LAB_0029188c;
          iVar3 = *piVar13;
          piVar13 = piVar13 + input_data->nrows;
        } while (-1 < iVar3);
        pcVar4[uVar5] = '\x01';
      }
LAB_0029188c:
      lVar7 = lVar7 + 4;
    }
  }
  sVar9 = 0;
  for (pcVar6 = (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar6 != (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar6 = pcVar6 + 1) {
    sVar9 = sVar9 + (long)*pcVar6;
  }
  input_data->n_missing = sVar9;
  allocate_imp<ImputedData<long,long_double>,InputData<float,long>>
            (input_data,impute_vec,impute_map,nthreads);
  return;
}

Assistant:

void check_for_missing(InputData &input_data,
                       std::vector<ImputedData> &impute_vec,
                       hashed_map<size_t, ImputedData> &impute_map,
                       int nthreads)
{
    input_data.has_missing.assign(input_data.nrows, false);

    if (input_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(col, input_data)
            for (size_t_for ix = input_data.Xc_indptr[col]; ix < (decltype(ix))input_data.Xc_indptr[col + 1]; ix++)
                if (is_na_or_inf(input_data.Xc[ix]))
                    input_data.has_missing[input_data.Xc_ind[ix]] = true;
            #pragma omp barrier
    }

    if (input_data.numeric_data != NULL || input_data.categ_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) shared(input_data)
        for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        {
            if (input_data.Xc_indptr == NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
            }

            if (!input_data.has_missing[row])
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    if (input_data.categ_data[row + col * input_data.nrows] < 0)
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
        }
    }

    input_data.n_missing = std::accumulate(input_data.has_missing.begin(), input_data.has_missing.end(), (size_t)0);
    allocate_imp(input_data, impute_vec, impute_map, nthreads);
}